

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Interprocedural.cpp
# Opt level: O2

void __thiscall
dg::pta::LLVMPointerGraphBuilder::addReturnNodesOperands
          (LLVMPointerGraphBuilder *this,Function *F,PointerSubgraph *subg,PSNode *callNode)

{
  _Base_ptr p_Var1;
  
  for (p_Var1 = (subg->returnNodes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(subg->returnNodes)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    if (callNode == (PSNode *)0x0) {
      addReturnNodeOperand(this,F,*(PSNode **)(p_Var1 + 1));
    }
    else {
      addReturnNodeOperand(callNode,*(PSNode **)(p_Var1 + 1));
    }
  }
  return;
}

Assistant:

void LLVMPointerGraphBuilder::addReturnNodesOperands(const llvm::Function *F,
                                                     PointerSubgraph &subg,
                                                     PSNode *callNode) {
    using namespace llvm;

    for (PSNode *r : subg.returnNodes) {
        // call-return node is like a PHI node
        // But we're interested only in the nodes that return some value
        // from subprocedure, not for all nodes that have no successor.
        if (callNode) {
            addReturnNodeOperand(callNode, r);
        } else {
            addReturnNodeOperand(F, r);
        }
    }
}